

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O1

UINT8 k051649_r(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  k051649_state *info;
  
  switch(offset >> 1) {
  case '\0':
  case '\x04':
    break;
  case '\x01':
  case '\x02':
  case '\x03':
    return 0xff;
  case '\x05':
    *(undefined1 *)((long)chip + 0x100) = 0xff;
    return 0xff;
  default:
    return '\0';
  }
  bVar3 = *(byte *)((long)chip + 0x101);
  bVar1 = *(byte *)((long)chip + 0x100);
  if (*(char *)((long)chip + 0x102) == '\0') {
    if (0x3f < bVar1) {
      if (bVar3 < 0x60) {
        if ((bVar1 & 0x40) == 0) goto LAB_00164eb1;
        lVar2 = (ulong)(bVar3 >> 5) * 0x2c + 8;
      }
      else {
        lVar2 = (ulong)(bVar1 >> 6 & 1) * 0x2c + 0x8c;
      }
      bVar3 = bVar3 + *(char *)((long)chip + lVar2 + 2);
    }
  }
  else if ((bVar1 & 0x40) != 0) {
    bVar3 = bVar3 + *(char *)((long)chip + (ulong)(bVar3 >> 5) * 0x2c + 10);
  }
LAB_00164eb1:
  return *(UINT8 *)((long)chip + (ulong)(bVar3 & 0x1f) + 0x12 + (ulong)(bVar3 >> 5) * 0x2c);
}

Assistant:

static UINT8 k051649_r(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	switch(offset >> 1)
	{
	case 0x00:
	case 0x04:
		if (! info->mode_plus)
			return k051649_waveform_r(chip, info->cur_reg);
		else
			return k052539_waveform_r(chip, info->cur_reg);
	case 0x01:
		return 0xFF;
	case 0x02:
		return 0xFF;
	case 0x03:
		return 0xFF;
	case 0x05:
		return k051649_test_r(chip, info->cur_reg);
	default:
		return 0x00;
	}
}